

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleserver.hpp
# Opt level: O0

Method SimpleServer::toMethod(string *method)

{
  bool bVar1;
  string *method_local;
  
  bVar1 = std::operator==(method,"GET");
  if (bVar1) {
    method_local._4_4_ = GET;
  }
  else {
    bVar1 = std::operator==(method,"HEAD");
    if (bVar1) {
      method_local._4_4_ = HEAD;
    }
    else {
      bVar1 = std::operator==(method,"POST");
      if (bVar1) {
        method_local._4_4_ = POST;
      }
      else {
        bVar1 = std::operator==(method,"OPTIONS");
        if (bVar1) {
          method_local._4_4_ = OPTIONS;
        }
        else {
          bVar1 = std::operator==(method,"CONNECT");
          if (bVar1) {
            method_local._4_4_ = CONNECT;
          }
          else {
            bVar1 = std::operator==(method,"TRACE");
            if (bVar1) {
              method_local._4_4_ = TRACE;
            }
            else {
              bVar1 = std::operator==(method,"PUT");
              if (bVar1) {
                method_local._4_4_ = PUT;
              }
              else {
                bVar1 = std::operator==(method,"PATCH");
                if (bVar1) {
                  method_local._4_4_ = PATCH;
                }
                else {
                  bVar1 = std::operator==(method,"DELETE");
                  if (!bVar1) {
                    __assert_fail("false && \"INVALID METHOD\"",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/lapinozz[P]SimpleServer/example/../include/SimpleServer/simpleserver.hpp"
                                  ,0xf5,"Method SimpleServer::toMethod(std::string)");
                  }
                  method_local._4_4_ = DELETE;
                }
              }
            }
          }
        }
      }
    }
  }
  return method_local._4_4_;
}

Assistant:

inline Method toMethod(std::string method)
	{
		if (method == "GET") return GET;
		else if (method == "HEAD") return HEAD;
		else if (method == "POST") return POST;
		else if (method == "OPTIONS") return OPTIONS;
		else if (method == "CONNECT") return CONNECT;
		else if (method == "TRACE") return TRACE;
		else if (method == "PUT") return PUT;
		else if (method == "PATCH") return PATCH;
		else if (method == "DELETE") return DELETE;

		assert(false && "INVALID METHOD");
	}